

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::LocaleDisplayNamesImpl::localeIdName
          (LocaleDisplayNamesImpl *this,char *localeId,UnicodeString *result)

{
  UnicodeString *pUVar1;
  
  if (this->nameLength == UDISPCTX_LENGTH_SHORT) {
    ICUDataTable::getNoFallback(&this->langData,"Languages%short",localeId,result);
    if ((undefined1  [56])((undefined1  [56])result->fUnion & (undefined1  [56])0x1) ==
        (undefined1  [56])0x0) {
      return result;
    }
  }
  pUVar1 = ICUDataTable::getNoFallback(&this->langData,"Languages",localeId,result);
  return pUVar1;
}

Assistant:

UnicodeString&
LocaleDisplayNamesImpl::localeIdName(const char* localeId,
                                     UnicodeString& result) const {
    if (nameLength == UDISPCTX_LENGTH_SHORT) {
        langData.getNoFallback("Languages%short", localeId, result);
        if (!result.isBogus()) {
            return result;
        }
    }
    return langData.getNoFallback("Languages", localeId, result);
}